

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_common.cpp
# Opt level: O0

void __thiscall RenderFuncTable::RenderFuncTable(RenderFuncTable *this)

{
  RenderFuncTable *in_RDI;
  array<RenderFunc,_4UL> *unaff_retaddr;
  BlendMode in_stack_0000000c;
  
  std::array<RenderFunc,_4UL>::array(unaff_retaddr);
  std::array<RenderFunc,_4UL>::array(unaff_retaddr);
  updateColor(this,in_stack_0000000c,(Color)unaff_retaddr);
  updateColor(this,in_stack_0000000c,(Color)unaff_retaddr);
  updateColor(this,in_stack_0000000c,(Color)unaff_retaddr);
  updateColor(this,in_stack_0000000c,(Color)unaff_retaddr);
  updateSrc(this,in_stack_0000000c,(Src)unaff_retaddr);
  updateSrc(this,in_stack_0000000c,(Src)unaff_retaddr);
  updateSrc(this,in_stack_0000000c,(Src)unaff_retaddr);
  updateSrc(this,in_stack_0000000c,(Src)unaff_retaddr);
  sse(in_RDI);
  return;
}

Assistant:

RenderFuncTable::RenderFuncTable()
{
    updateColor(BlendMode::Src, color_Source);
    updateColor(BlendMode::SrcOver, color_SourceOver);
    updateColor(BlendMode::DestIn, color_DestinationIn);
    updateColor(BlendMode::DestOut, color_DestinationOut);

    updateSrc(BlendMode::Src, src_Source);
    updateSrc(BlendMode::SrcOver, src_SourceOver);
    updateSrc(BlendMode::DestIn, src_DestinationIn);
    updateSrc(BlendMode::DestOut, src_DestinationOut);

#if defined(__ARM_NEON__)
    neon();
#endif
#if defined(__SSE2__)
    sse();
#endif
}